

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall Chainstate::TryAddBlockIndexCandidate(Chainstate *this,CBlockIndex *pindex)

{
  pointer ppCVar1;
  pointer ppCVar2;
  bool bVar3;
  Chainstate *pCVar4;
  CBlockIndex **ppCVar5;
  CBlockIndex *pCVar6;
  long in_FS_OFFSET;
  CBlockIndex *local_20;
  CBlockIndex *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_18 = pindex;
  if ((ppCVar2 != ppCVar1) && (ppCVar2[-1] != (CBlockIndex *)0x0)) {
    if (ppCVar2 == ppCVar1) {
      pCVar6 = (CBlockIndex *)0x0;
    }
    else {
      pCVar6 = ppCVar2[-1];
    }
    bVar3 = ::node::CBlockIndexWorkComparator::operator()
                      ((CBlockIndexWorkComparator *)&local_20,pindex,pCVar6);
    if (bVar3) goto LAB_0040112e;
  }
  pCVar4 = ChainstateManager::ActiveChainstate(this->m_chainman);
  if (pCVar4 != this) {
    if (this->m_disabled != false) goto LAB_0040112e;
    pCVar4 = this->m_chainman->m_active_chainstate;
    if (pCVar4 == (Chainstate *)0x0) {
      local_20 = (CBlockIndex *)0x0;
    }
    else {
      local_20 = SnapshotBase(pCVar4);
    }
    ppCVar5 = inline_assertion_check<true,CBlockIndex_const*>
                        (&local_20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                         ,0xef5,"TryAddBlockIndexCandidate","m_chainman.GetSnapshotBaseBlock()");
    pCVar6 = CBlockIndex::GetAncestor(*ppCVar5,local_18->nHeight);
    if (pCVar6 != local_18) goto LAB_0040112e;
  }
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*const&>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
              *)&this->setBlockIndexCandidates,&local_18);
LAB_0040112e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::TryAddBlockIndexCandidate(CBlockIndex* pindex)
{
    AssertLockHeld(cs_main);
    // The block only is a candidate for the most-work-chain if it has the same
    // or more work than our current tip.
    if (m_chain.Tip() != nullptr && setBlockIndexCandidates.value_comp()(pindex, m_chain.Tip())) {
        return;
    }

    bool is_active_chainstate = this == &m_chainman.ActiveChainstate();
    if (is_active_chainstate) {
        // The active chainstate should always add entries that have more
        // work than the tip.
        setBlockIndexCandidates.insert(pindex);
    } else if (!m_disabled) {
        // For the background chainstate, we only consider connecting blocks
        // towards the snapshot base (which can't be nullptr or else we'll
        // never make progress).
        const CBlockIndex* snapshot_base{Assert(m_chainman.GetSnapshotBaseBlock())};
        if (snapshot_base->GetAncestor(pindex->nHeight) == pindex) {
            setBlockIndexCandidates.insert(pindex);
        }
    }
}